

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::BufferBindingValidator::validateSingleBlock
          (BufferBindingValidator *this,InterfaceBlock *block,
          vector<int,_std::allocator<int>_> *instanceIndex,string *resource,GLint propValue,
          string *implementationName)

{
  ostringstream *poVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  allocator<char> local_1a9;
  undefined1 local_1a8 [384];
  
  iVar2 = (block->layout).binding;
  if (iVar2 == -1) {
    local_1a8._0_8_ = ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Verifying buffer binding, expecting a valid binding");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    if (-1 < propValue) {
      return;
    }
    local_1a8._0_8_ = ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tError, invalid buffer binding, got ");
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"buffer binding invalid",&local_1a9);
    PropValidator::setError((PropValidator *)this,(string *)local_1a8);
  }
  else {
    piVar3 = (block->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (block->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = (ulong)((long)piVar4 - (long)piVar3) >> 2 & 0xffffffff;
    iVar6 = 1;
    iVar8 = 0;
    while( true ) {
      uVar5 = uVar5 - 1;
      if ((int)(uint)uVar5 < 0) break;
      uVar7 = (uint)uVar5 & 0x7fffffff;
      iVar8 = iVar8 + (instanceIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar7] * iVar6;
      iVar6 = iVar6 * piVar3[uVar7];
    }
    if (piVar3 == piVar4) {
      iVar8 = 0;
    }
    local_1a8._0_8_ = ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Verifying block binding, expecting ");
    iVar8 = iVar8 + iVar2;
    std::ostream::operator<<(poVar1,iVar8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    if (iVar8 == propValue) {
      return;
    }
    local_1a8._0_8_ = ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tError, invalid buffer binding, got ");
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"buffer binding invalid",&local_1a9);
    PropValidator::setError((PropValidator *)this,(string *)local_1a8);
  }
  std::__cxx11::string::~string((string *)local_1a8);
  return;
}

Assistant:

void BufferBindingValidator::validateSingleBlock (const glu::InterfaceBlock& block, const std::vector<int>& instanceIndex, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	if (block.layout.binding != -1)
	{
		int flatIndex		= 0;
		int dimensionSize	= 1;

		for (int dimensionNdx = (int)(block.dimensions.size()) - 1; dimensionNdx >= 0; --dimensionNdx)
		{
			flatIndex += dimensionSize * instanceIndex[dimensionNdx];
			dimensionSize *= block.dimensions[dimensionNdx];
		}

		const int expected = (block.dimensions.empty()) ? (block.layout.binding) : (block.layout.binding + flatIndex);
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying block binding, expecting " << expected << tcu::TestLog::EndMessage;

		if (propValue != expected)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid buffer binding, got " << propValue << tcu::TestLog::EndMessage;
			setError("buffer binding invalid");
		}
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying buffer binding, expecting a valid binding" << tcu::TestLog::EndMessage;

		if (propValue < 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid buffer binding, got " << propValue << tcu::TestLog::EndMessage;
			setError("buffer binding invalid");
		}
	}
}